

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_287390::CAPIBuildSystemFrontendDelegate::commandFoundDiscoveredDependency
          (CAPIBuildSystemFrontendDelegate *this,Command *command,StringRef path,
          DiscoveredDependencyKind kind)

{
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_char_ptr_llb_buildsystem_discovered_dependency_kind_t
  *p_Var1;
  void *pvVar2;
  char *pcVar3;
  char *local_48;
  undefined8 local_40;
  char local_38;
  undefined7 uStack_37;
  
  pcVar3 = path.Data;
  p_Var1 = (this->cAPIDelegate).command_found_discovered_dependency;
  if (p_Var1 != (_func_void_void_ptr_llb_buildsystem_command_t_ptr_char_ptr_llb_buildsystem_discovered_dependency_kind_t
                 *)0x0) {
    pvVar2 = (this->cAPIDelegate).context;
    local_48 = &local_38;
    if (pcVar3 == (char *)0x0) {
      local_40 = 0;
      local_38 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,pcVar3,pcVar3 + path.Length);
    }
    (*p_Var1)(pvVar2,(llb_buildsystem_command_t *)command,local_48,kind);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
  }
  return;
}

Assistant:

virtual void commandFoundDiscoveredDependency(Command* command, StringRef path, DiscoveredDependencyKind kind) override {
    if (cAPIDelegate.command_found_discovered_dependency) {
      cAPIDelegate.command_found_discovered_dependency(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          path.str().c_str(),
          (llb_buildsystem_discovered_dependency_kind_t) kind);
    }
  }